

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zm.c
# Opt level: O1

void zmCreate(qr_o *r,octet *mod,size_t no,void *stack)

{
  bool_t bVar1;
  void *stack_00;
  
  stack_00 = stack;
  if (0x10 < no) {
    if ((no & 7) == 0) {
      bVar1 = memIsZero(mod,8);
      if (bVar1 == 0) {
        bVar1 = memIsRep(mod + 8,no - 8,0xff);
        if (bVar1 != 0) {
          zmCreateCrand(r,mod,no,stack_00);
          return;
        }
      }
    }
    if ((*mod & 1) != 0) {
      zmCreateMont(r,mod,no,stack);
      return;
    }
    if (0x1f < no) {
      zmCreateBarr(r,mod,no,stack);
      return;
    }
  }
  zmCreatePlain(r,mod,no,stack_00);
  return;
}

Assistant:

void zmCreate(qr_o* r, const octet mod[], size_t no, void* stack)
{
	ASSERT(memIsValid(r, sizeof(qr_o)));
	ASSERT(memIsValid(mod, no));
	ASSERT(no > 0 && mod[no - 1] > 0);
	// короткий модуль?
	if (no <= 2 * O_PER_W)
		zmCreatePlain(r, mod, no, stack);
	// подходит редукция Крэндалла?
	else if (no % O_PER_W == 0 && no >= 2 * O_PER_W &&
		!memIsZero(mod, O_PER_W) &&
		memIsRep(mod + O_PER_W, no - O_PER_W, 0xFF))
		zmCreateCrand(r, mod, no, stack);
	// подходит редукция Монтгомери?
	else if (mod[0] % 2)
		zmCreateMont(r, mod, no, stack);
	// длинный модуль?
	else if (no >= 4 * O_PER_W)
		zmCreateBarr(r, mod, no, stack);
	// средний четный модуль
	else
		zmCreatePlain(r, mod, no, stack);
}